

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

PBuffer __thiscall Buffer::get_subbuffer(Buffer *this,size_t offset,size_t _size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  PBuffer PVar2;
  undefined1 local_49;
  __shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  unsigned_long local_38;
  size_t local_30;
  
  local_30 = _size;
  std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Buffer,void>
            (local_48,(__weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(offset + 8));
  std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Buffer>,std::shared_ptr<Buffer>,unsigned_long&,unsigned_long&,Buffer::EndianessMode&>
            ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)this,(allocator<Buffer> *)&local_49,
             (shared_ptr<Buffer> *)local_48,&local_30,&local_38,(EndianessMode *)(offset + 0x48));
  _Var1._M_pi = extraout_RDX;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    _Var1._M_pi = extraout_RDX_00;
  }
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PBuffer)PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
Buffer::get_subbuffer(size_t offset, size_t _size) {
  return std::make_shared<Buffer>(shared_from_this(), offset, _size, endianess);
}